

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeExprOrVector(Parse *pParse,Expr *p,int iReg,int nReg)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  ExprList *pList;
  int i;
  int iSelect;
  Vdbe *v;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar3;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Parse *in_stack_ffffffffffffffe0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if ((in_RSI == 0) || (iVar1 = sqlite3ExprIsVector((Expr *)0x20c02c), iVar1 == 0)) {
    sqlite3ExprCode(in_stack_ffffffffffffffe0,
                    (Expr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),iVar2);
  }
  else if ((*(uint *)(in_RSI + 4) & 0x1000) == 0) {
    uVar3 = *(undefined8 *)(in_RSI + 0x20);
    for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
      sqlite3ExprCode(in_stack_ffffffffffffffe0,(Expr *)CONCAT44(in_stack_ffffffffffffffdc,iVar2),
                      (int)((ulong)uVar3 >> 0x20));
    }
  }
  else {
    uVar3 = *(undefined8 *)(in_RDI + 0x10);
    iVar2 = sqlite3CodeSubselect((Parse *)v,_i);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_EDX,in_ECX),(int)((ulong)uVar3 >> 0x20),(int)uVar3,iVar2,
                      in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void codeExprOrVector(Parse *pParse, Expr *p, int iReg, int nReg){
  assert( nReg>0 );
  if( p && sqlite3ExprIsVector(p) ){
#ifndef SQLITE_OMIT_SUBQUERY
    if( ExprUseXSelect(p) ){
      Vdbe *v = pParse->pVdbe;
      int iSelect;
      assert( p->op==TK_SELECT );
      iSelect = sqlite3CodeSubselect(pParse, p);
      sqlite3VdbeAddOp3(v, OP_Copy, iSelect, iReg, nReg-1);
    }else
#endif
    {
      int i;
      const ExprList *pList;
      assert( ExprUseXList(p) );
      pList = p->x.pList;
      assert( nReg<=pList->nExpr );
      for(i=0; i<nReg; i++){
        sqlite3ExprCode(pParse, pList->a[i].pExpr, iReg+i);
      }
    }
  }else{
    assert( nReg==1 || pParse->nErr );
    sqlite3ExprCode(pParse, p, iReg);
  }
}